

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

bool boost::filesystem::detail::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  file_type fVar2;
  long lVar3;
  string_type *psVar4;
  char *pcVar5;
  unspecified_bool_type p_Var6;
  filesystem_error *this;
  error_code ec_00;
  allocator<char> local_d1;
  string local_d0;
  file_status local_b0;
  file_status parent_status;
  path parent;
  file_status p_status;
  error_code local_78;
  path local_60;
  undefined1 local_40 [8];
  path filename;
  error_code *ec_local;
  path *p_local;
  
  filename.m_pathname.field_2._8_8_ = ec;
  filesystem::path::filename((path *)local_40,p);
  filesystem::path::native_abi_cxx11_((path *)local_40);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 1) {
    psVar4 = filesystem::path::native_abi_cxx11_((path *)local_40);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
    if (*pcVar5 != '.') goto LAB_00113264;
LAB_001132be:
    filesystem::path::parent_path(&local_60,p);
    p_local._7_1_ = create_directories(&local_60,(error_code *)filename.m_pathname.field_2._8_8_);
    filesystem::path::~path(&local_60);
    goto LAB_001135c9;
  }
LAB_00113264:
  filesystem::path::native_abi_cxx11_((path *)local_40);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 2) {
    psVar4 = filesystem::path::native_abi_cxx11_((path *)local_40);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
    if (*pcVar5 == '.') {
      psVar4 = filesystem::path::native_abi_cxx11_((path *)local_40);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
      if (*pcVar5 == '.') goto LAB_001132be;
    }
  }
  system::error_code::error_code((error_code *)&p_status);
  filesystem::status((filesystem *)(parent.m_pathname.field_2._M_local_buf + 8),p,
                     (error_code *)&p_status);
  fVar2 = file_status::type((file_status *)((long)&parent.m_pathname.field_2 + 8));
  if (fVar2 == directory_file) {
    if (filename.m_pathname.field_2._8_8_ != 0) {
      system::error_code::clear((error_code *)filename.m_pathname.field_2._8_8_);
    }
    p_local._7_1_ = false;
    goto LAB_001135c9;
  }
  filesystem::path::parent_path((path *)&parent_status,p);
  bVar1 = operator!=((path *)&parent_status,p);
  if (!bVar1) {
    __assert_fail("(parent != p)&&(\"internal error: p == p.parent_path()\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x3bd,
                  "bool boost::filesystem::detail::create_directories(const path &, system::error_code *)"
                 );
  }
  bVar1 = filesystem::path::empty((path *)&parent_status);
  if (bVar1) {
LAB_00113586:
    p_local._7_1_ = create_directory(p,(error_code *)filename.m_pathname.field_2._8_8_);
  }
  else {
    filesystem::status((filesystem *)&local_b0,(path *)&parent_status,(error_code *)&p_status);
    fVar2 = file_status::type(&local_b0);
    if (fVar2 != file_not_found) goto LAB_00113586;
    filesystem::create_directories((path *)&parent_status,(error_code *)&p_status);
    p_Var6 = system::error_code::operator_cast_to_function_pointer((error_code *)&p_status);
    if (p_Var6 == (unspecified_bool_type)0x0) goto LAB_00113586;
    if (filename.m_pathname.field_2._8_8_ == 0) {
      this = (filesystem_error *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"boost::filesystem::create_directories",&local_d1);
      ec_00._0_8_ = (ulong)p_status & 0xffffffff;
      ec_00.m_cat = (error_category *)local_78._0_8_;
      filesystem_error::filesystem_error(this,&local_d0,(path *)&parent_status,ec_00);
      __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    *(file_status *)filename.m_pathname.field_2._8_8_ = p_status;
    *(undefined8 *)(filename.m_pathname.field_2._8_8_ + 8) = local_78._0_8_;
    p_local._7_1_ = false;
  }
  filesystem::path::~path((path *)&parent_status);
LAB_001135c9:
  filesystem::path::~path((path *)local_40);
  return p_local._7_1_;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool create_directories(const path& p, system::error_code* ec)
  {
    path filename(p.filename());
    if ((filename.native().size() == 1 && filename.native()[0] == dot)
      || (filename.native().size() == 2
        && filename.native()[0] == dot && filename.native()[1] == dot))
      return create_directories(p.parent_path(), ec);

    error_code local_ec;
    file_status p_status = status(p, local_ec);

    if (p_status.type() == directory_file)
    {
      if (ec != 0)
        ec->clear();
      return false;
    }

    path parent = p.parent_path();
    BOOST_ASSERT_MSG(parent != p, "internal error: p == p.parent_path()");
    if (!parent.empty())
    {
      // determine if the parent exists
      file_status parent_status = status(parent, local_ec);

      // if the parent does not exist, create the parent
      if (parent_status.type() == file_not_found)
      {
        create_directories(parent, local_ec);
        if (local_ec)
        {
          if (ec == 0)
            BOOST_FILESYSTEM_THROW(filesystem_error(
              "boost::filesystem::create_directories", parent, local_ec));
          else
            *ec = local_ec;
          return false;
        }
      }
    }

    // create the directory
    return create_directory(p, ec);
  }